

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O2

char * Fantasy_Rapunzel_parse_json_struct_inline
                 (flatcc_json_parser_t *ctx,char *buf,char *end,void *struct_base)

{
  char *pcVar1;
  uint64_t uVar2;
  char *buf_00;
  uint16_t val;
  int more;
  uint16_t *local_38;
  
  local_38 = (uint16_t *)struct_base;
  pcVar1 = flatcc_json_parser_object_start(ctx,buf,end,&more);
  do {
    if (more == 0) {
      return pcVar1;
    }
    pcVar1 = flatcc_json_parser_symbol_start(ctx,pcVar1,end);
    uVar2 = flatcc_json_parser_symbol_part(pcVar1,end);
    if (uVar2 == 0x686169725f6c656e) {
      pcVar1 = pcVar1 + 8;
      uVar2 = flatcc_json_parser_symbol_part(pcVar1,end);
      if ((uint)(uVar2 >> 0x28) != 0x677468) goto LAB_0011129a;
      buf_00 = flatcc_json_parser_match_symbol(ctx,pcVar1,end,3);
      if (pcVar1 == buf_00) {
        pcVar1 = flatcc_json_parser_unmatched_symbol(ctx,buf_00,end);
      }
      else {
        val = 0;
        pcVar1 = flatcc_json_parser_uint16(ctx,buf_00,end,&val);
        if ((buf_00 == pcVar1) &&
           ((pcVar1 = flatcc_json_parser_symbolic_uint16
                                (ctx,pcVar1,end,
                                 Fantasy_Rapunzel_parse_json_struct_inline::symbolic_parsers,&val),
            pcVar1 == buf_00 || (pcVar1 == end)))) {
          pcVar1 = flatcc_json_parser_set_error(ctx,pcVar1,end,0x23);
          return pcVar1;
        }
        *local_38 = val;
      }
    }
    else {
LAB_0011129a:
      pcVar1 = flatcc_json_parser_unmatched_symbol(ctx,pcVar1,end);
    }
    pcVar1 = flatcc_json_parser_object_end(ctx,pcVar1,end,&more);
  } while( true );
}

Assistant:

static const char *Fantasy_Rapunzel_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base)
{
    int more;
    flatcc_builder_ref_t ref;
    void *pval;
    const char *mark;
    uint64_t w;

    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w == 0x686169725f6c656e) { /* descend "hair_len" */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if ((w & 0xffffff0000000000) == 0x6774680000000000) { /* "gth" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                if (mark != buf) {
                    uint16_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            monster_test_local_Fantasy_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    pval = (void *)((size_t)struct_base + 0);
                    buf = flatcc_json_parser_uint16(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_uint16(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    flatbuffers_uint16_write_to_pe(pval, val);
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "gth" */
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            } /* "gth" */
        } else { /* descend "hair_len" */
            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
        } /* descend "hair_len" */
        buf = flatcc_json_parser_object_end(ctx, buf, end , &more);
    }
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}